

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O0

ulint __thiscall bwtil::IndexedBWT::rank(IndexedBWT *this,uchar c,ulint i)

{
  ulint uVar1;
  ulong uVar2;
  ulong in_RDX;
  char in_SIL;
  ulint in_RDI;
  WaveletTree *unaff_retaddr;
  undefined8 in_stack_fffffffffffffff8;
  uchar c_00;
  
  if (in_SIL == -1) {
    uVar2 = (ulong)(*(ulong *)(in_RDI + 0x10) < in_RDX);
  }
  else {
    c_00 = (uchar)((ulong)in_stack_fffffffffffffff8 >> 0x38);
    if ((in_SIL == '\0') && (*(ulong *)(in_RDI + 0x10) < in_RDX)) {
      uVar1 = WaveletTree::rank(unaff_retaddr,c_00,in_RDI);
      uVar2 = uVar1 - 1;
    }
    else {
      uVar2 = WaveletTree::rank(unaff_retaddr,c_00,in_RDI);
    }
  }
  return uVar2;
}

Assistant:

ulint rank(uchar c, ulint i){//number of characters 'c' before position i excluded

		if(c==TERMINATOR)
			return i>terminator_position;

		if(c==0 and i>terminator_position)//this because the terminator in the wavelet tree is encoded as 0
			return bwt_wt.rank(0,i)-1;

		return bwt_wt.rank(c,i);

	}